

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

StatementMap *
Js::FunctionBody::
GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
          (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *statementMapList,int *startingAtIndex)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  WriteBarrierPtr *pWVar6;
  StatementMap **ppSVar7;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_28;
  StatementMap *map;
  int *startingAtIndex_local;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *statementMapList_local;
  
  if (statementMapList ==
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xb3a,"(statementMapList != nullptr)",
                                "Must have valid statementMapList to execute");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pWVar6 = (WriteBarrierPtr *)
           JsUtil::
           List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(statementMapList,*startingAtIndex);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(pWVar6);
  local_28 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)*ppSVar7;
  while( true ) {
    bVar3 = false;
    if ((*(Type *)&(local_28->
                   super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   ).count & 1U) != 0) {
      iVar1 = *startingAtIndex;
      iVar4 = JsUtil::
              ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
              Count(&statementMapList->
                     super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   );
      bVar3 = iVar1 < iVar4 + -1;
    }
    if (!bVar3) break;
    iVar1 = *startingAtIndex;
    *startingAtIndex = iVar1 + 1;
    pWVar6 = (WriteBarrierPtr *)
             JsUtil::
             List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(statementMapList,iVar1 + 1);
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(pWVar6);
    local_28 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)*ppSVar7;
  }
  if ((*(Type *)&(local_28->
                 super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                 ).count & 1U) == 0) {
    statementMapList_local = local_28;
  }
  else {
    statementMapList_local =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
  }
  return (StatementMap *)statementMapList_local;
}

Assistant:

FunctionBody::StatementMap * FunctionBody::GetNextNonSubexpressionStatementMap(TStatementMapList *statementMapList, int & startingAtIndex)
    {
        AssertMsg(statementMapList != nullptr, "Must have valid statementMapList to execute");

        FunctionBody::StatementMap *map = statementMapList->Item(startingAtIndex);
        while (map->isSubexpression && startingAtIndex < statementMapList->Count() - 1)
        {
            map = statementMapList->Item(++startingAtIndex);
        }
        if (map->isSubexpression)   // Didn't find any non inner maps
        {
            return nullptr;
        }
        return map;
    }